

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O1

int drive_compressor(archive_write_filter *f,private_data_conflict8 *data,int flush,void *src,
                    size_t length)

{
  ZSTD_outBuffer *output;
  anon_enum_32 aVar1;
  size_t sVar2;
  size_t sVar3;
  archive *a;
  uint uVar4;
  int iVar5;
  size_t code;
  ulong uVar6;
  char *pcVar7;
  ZSTD_inBuffer in;
  ZSTD_inBuffer local_48;
  
  local_48.pos = 0;
  output = &data->out;
  local_48.src = src;
  local_48.size = length;
  do {
    sVar3 = local_48.pos;
    sVar2 = (data->out).pos;
    aVar1 = data->state;
    if (aVar1 == resetting) {
      ZSTD_CCtx_reset(data->cstream,ZSTD_reset_session_only);
      data->cur_frame = data->cur_frame + 1;
      data->state = running;
      data->cur_frame_in = 0;
      data->cur_frame_out = 0;
    }
    else if (aVar1 == finishing) {
      code = ZSTD_endStream(data->cstream,output);
      uVar4 = ZSTD_isError(code);
      if (uVar4 != 0) {
LAB_0016c6ce:
        a = f->archive;
        pcVar7 = ZSTD_getErrorName(code);
        archive_set_error(a,-1,"Zstd compression failed: %s",pcVar7);
        return -0x1e;
      }
      if (code == 0) {
        data->state = resetting;
      }
    }
    else if (aVar1 == running) {
      if (local_48.pos == local_48.size) {
        return 0;
      }
      code = ZSTD_compressStream(data->cstream,output,&local_48);
      uVar4 = ZSTD_isError(code);
      if (uVar4 != 0) goto LAB_0016c6ce;
    }
    data->total_in = data->total_in + (local_48.pos - sVar3);
    uVar6 = (local_48.pos - sVar3) + data->cur_frame_in;
    data->cur_frame_in = uVar6;
    sVar3 = (data->out).pos;
    data->cur_frame_out = data->cur_frame_out + (sVar3 - sVar2);
    if ((data->state == running) && (data->max_frame_size <= uVar6)) {
      data->state = finishing;
    }
    if ((sVar3 == (data->out).size) || (flush != 0 && sVar3 != 0)) {
      iVar5 = __archive_write_filter(f->next_filter,output->dst,sVar3);
      if (iVar5 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
    }
  } while( true );
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			data->stream.next_out = data->compressed;
			data->stream.avail_out =
			    (uInt)data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = deflate(&(data->stream),
		    finishing ? Z_FINISH : Z_NO_FLUSH );

		switch (ret) {
		case Z_OK:
			/* In non-finishing case, check if compressor
			 * consumed everything */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			/* In finishing case, this return always means
			 * there's more work */
			break;
		case Z_STREAM_END:
			/* This return can only occur in finishing case. */
			return (ARCHIVE_OK);
		default:
			/* Any other return value indicates an error. */
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "GZip compression failed:"
			    " deflate() call returned status %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}